

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlResponsePoller.cpp
# Opt level: O1

int __thiscall
aeron::archive::ControlResponsePoller::poll
          (ControlResponsePoller *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  int iVar1;
  element_type *peVar2;
  __pointer_type pIVar3;
  int iVar4;
  ulong uVar5;
  Image *this_00;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  Image *this_01;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  *(undefined4 *)&this->relevantId_ = 0xffffffff;
  *(undefined4 *)((long)&this->relevantId_ + 4) = 0xffffffff;
  *(undefined4 *)&this->templateId_ = 0xffffffff;
  *(undefined4 *)((long)&this->templateId_ + 4) = 0xffffffff;
  *(undefined4 *)&this->controlSessionId_ = 0xffffffff;
  *(undefined4 *)((long)&this->controlSessionId_ + 4) = 0xffffffff;
  *(undefined4 *)&this->correlationId_ = 0xffffffff;
  *(undefined4 *)((long)&this->correlationId_ + 4) = 0xffffffff;
  this->isPollComplete_ = false;
  peVar2 = (this->subscription_).super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = &this->fragmentAssembler_;
  pcStack_40 = std::
               _Function_handler<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ControlledFragmentAssembler.h:64:16)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ControlledFragmentAssembler.h:64:16)>
             ::_M_manager;
  iVar1 = this->fragmentLimit_;
  pIVar3 = (peVar2->m_imageList)._M_b._M_p;
  this_00 = pIVar3->m_images;
  uVar6 = pIVar3->m_length;
  uVar5 = peVar2->m_roundRobinIndex;
  uVar9 = 0;
  uVar7 = uVar5 + 1;
  if (uVar6 <= uVar5) {
    uVar5 = uVar9;
    uVar7 = uVar9;
  }
  peVar2->m_roundRobinIndex = uVar7;
  if ((0 < iVar1) && (uVar5 < uVar6)) {
    this_01 = this_00 + uVar5;
    uVar8 = 0;
    uVar7 = uVar5;
    do {
      uVar7 = uVar7 + 1;
      iVar4 = Image::
              controlledPoll<std::function<aeron::ControlledPollAction(aeron::concurrent::AtomicBuffer&,int,int,aeron::concurrent::logbuffer::Header&)>&>
                        (this_01,(function<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
                                  *)&local_58,iVar1 - uVar8);
      uVar8 = iVar4 + uVar8;
      uVar9 = (ulong)uVar8;
      if (uVar6 <= uVar7) break;
      this_01 = this_01 + 1;
    } while ((int)uVar8 < iVar1);
  }
  uVar8 = (uint)uVar9;
  if ((uVar5 != 0) && ((int)uVar8 < iVar1)) {
    uVar6 = 1;
    do {
      iVar4 = Image::
              controlledPoll<std::function<aeron::ControlledPollAction(aeron::concurrent::AtomicBuffer&,int,int,aeron::concurrent::logbuffer::Header&)>&>
                        (this_00,(function<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
                                  *)&local_58,iVar1 - (int)uVar9);
      uVar8 = (int)uVar9 + iVar4;
      uVar9 = (ulong)uVar8;
      if (uVar5 <= uVar6) break;
      uVar6 = uVar6 + 1;
      this_00 = this_00 + 1;
    } while ((int)uVar8 < iVar1);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return uVar8;
}

Assistant:

std::int32_t ControlResponsePoller::poll() {
    controlSessionId_ = -1;
    correlationId_ = -1;
    relevantId_ = -1;
    templateId_ = -1;
    isPollComplete_ = false;

    return subscription_->controlledPoll(fragmentAssembler_.handler(), fragmentLimit_);
}